

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool flatbuffers::DeserializeAttributesCommon
               (SymbolTable<flatbuffers::Value> *attributes,Parser *parser,
               Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs)

{
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  long *plVar4;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar5;
  bool bVar6;
  ulong uVar7;
  Value *e;
  long lVar8;
  ulong uVar9;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_60;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *local_48;
  SymbolTable<flatbuffers::Value> *local_40;
  long local_38;
  
  if ((attrs != (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0) &&
     (*(int *)attrs != 0)) {
    local_48 = attrs + 4;
    paVar2 = &local_80.field_2;
    local_60 = &parser->known_attributes_;
    local_38 = 0;
    uVar9 = 0;
    local_58 = attrs;
    local_40 = attributes;
    do {
      pVVar5 = local_48;
      uVar7 = (ulong)((uint)local_38 & 0xfffffffc);
      uVar3 = *(uint *)(local_48 + uVar7);
      pVVar1 = local_48 + uVar3 + uVar7;
      e = (Value *)operator_new(0x48);
      local_50 = &(e->constant).field_2;
      (e->type).base_type = BASE_TYPE_NONE;
      (e->type).element = BASE_TYPE_NONE;
      (e->type).struct_def = (StructDef *)0x0;
      *(undefined8 *)((long)&(e->type).struct_def + 2) = 0;
      *(undefined8 *)((long)&(e->type).enum_def + 2) = 0;
      (e->constant)._M_dataplus._M_p = (pointer)local_50;
      *(undefined2 *)&(e->constant).field_2 = 0x30;
      (e->constant)._M_string_length = 1;
      e->offset = 0xffff;
      lVar8 = -(long)*(int *)(pVVar5 + uVar3 + uVar7);
      if (6 < *(ushort *)(pVVar1 + -(long)*(int *)(pVVar5 + uVar3 + uVar7))) {
        uVar7 = (ulong)*(ushort *)(pVVar1 + lVar8 + 6);
        if (uVar7 != 0) {
          local_80._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pVVar1 + *(uint *)(pVVar1 + uVar7) + uVar7 + 4,
                     pVVar1 + (ulong)*(uint *)(pVVar1 + *(uint *)(pVVar1 + uVar7) + uVar7) +
                              *(uint *)(pVVar1 + uVar7) + uVar7 + 4);
          std::__cxx11::string::operator=((string *)&e->constant,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          lVar8 = -(long)*(int *)pVVar1;
        }
      }
      uVar7 = (ulong)*(ushort *)(pVVar1 + lVar8 + 4);
      local_80._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,pVVar1 + *(uint *)(pVVar1 + uVar7) + uVar7 + 4,
                 pVVar1 + (ulong)*(uint *)(pVVar1 + *(uint *)(pVVar1 + uVar7) + uVar7) +
                          *(uint *)(pVVar1 + uVar7) + uVar7 + 4);
      bVar6 = SymbolTable<flatbuffers::Value>::Add(local_40,&local_80,e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        plVar4 = (long *)(e->constant)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar4 != local_50) {
          operator_delete(plVar4,local_50->_M_allocated_capacity + 1);
        }
        operator_delete(e,0x48);
        return false;
      }
      uVar7 = (ulong)*(ushort *)(pVVar1 + (4 - (long)*(int *)pVVar1));
      local_80._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,pVVar1 + (ulong)*(uint *)(pVVar1 + uVar7) + 4 + uVar7,
                 pVVar1 + (ulong)*(uint *)(pVVar1 + (ulong)*(uint *)(pVVar1 + uVar7) + 4 + uVar7 +
                                          -4) + *(uint *)(pVVar1 + uVar7) + uVar7 + 4);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::operator[](local_60,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      uVar9 = uVar9 + 1;
      local_38 = local_38 + 4;
    } while (uVar9 < *(uint *)local_58);
  }
  return true;
}

Assistant:

static bool DeserializeAttributesCommon(
    SymbolTable<Value> &attributes, Parser &parser,
    const Vector<Offset<reflection::KeyValue>> *attrs) {
  if (attrs == nullptr) return true;
  for (uoffset_t i = 0; i < attrs->size(); ++i) {
    auto kv = attrs->Get(i);
    auto value = new Value();
    if (kv->value()) { value->constant = kv->value()->str(); }
    if (attributes.Add(kv->key()->str(), value)) {
      delete value;
      return false;
    }
    parser.known_attributes_[kv->key()->str()];
  }
  return true;
}